

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

size_t __thiscall
CVmObjByteArray::map_to_string
          (CVmObjByteArray *this,unsigned_long idx,unsigned_long len,CVmObjString *str,
          size_t str_len,CCharmapToUni *mapper)

{
  long lVar1;
  CVmObjString *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_R9;
  size_t partial_len;
  size_t str_cur;
  size_t copy_len;
  char *dst;
  uchar buf [128];
  size_t buf_len;
  size_t str_total;
  char *local_f8;
  size_t local_e8;
  ulong local_e0;
  ulong local_d8;
  char *local_d0;
  size_t in_stack_ffffffffffffff38;
  unsigned_long in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff48;
  CVmObjByteArray *in_stack_ffffffffffffff50;
  size_t local_40;
  size_t local_38;
  undefined1 local_28 [16];
  ulong local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RCX == (CVmObjString *)0x0) {
    local_f8 = (char *)0x0;
  }
  else {
    local_f8 = CVmObjString::cons_get_buf(in_RCX);
  }
  local_d0 = local_f8;
  local_38 = 0;
  local_40 = 0;
  while( true ) {
    if (local_18 == 0) {
      return local_38;
    }
    local_d8 = 0x80 - local_40;
    if (local_18 < local_d8) {
      local_d8 = local_18;
    }
    copy_to_buf(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff38);
    lVar1 = local_d8 + local_40;
    local_10 = local_d8 + local_10;
    local_18 = local_18 - local_d8;
    local_e0 = (**(code **)(*in_R9 + 0x28))
                         (in_R9,&local_d0,local_28,&stack0xffffffffffffff38,lVar1,&local_e8);
    if (0xfffffffd - local_38 < local_e0) break;
    local_38 = local_e0 + local_38;
    if (local_e8 != 0) {
      memmove(&stack0xffffffffffffff38,&stack0xffffffffffffff38 + (lVar1 - local_e8),local_e8);
    }
    local_40 = local_e8;
  }
  err_throw(0);
}

Assistant:

size_t CVmObjByteArray::map_to_string(unsigned long idx,
                                      unsigned long len,
                                      CVmObjString *str, size_t str_len,
                                      CCharmapToUni *mapper)
{
    size_t str_total;
    size_t buf_len;
    unsigned char buf[128];
    char *dst;

    /* get the string's buffer pointer */
    dst = (str != 0 ? str->cons_get_buf() : 0);
    
    /* go through the source bytes a bit at a time */
    for (str_total = 0, buf_len = 0 ; len != 0 ; )
    {
        size_t copy_len;
        size_t str_cur;
        size_t partial_len;
        
        /* 
         *   fill up the buffer, up to the remaining source length or the
         *   buffer's capacity, whichever is lower 
         */
        copy_len = sizeof(buf) - buf_len;
        if (copy_len > len)
            copy_len = (size_t)len;

        /* copy the bytes to our staging buffer */
        copy_to_buf(buf, idx, copy_len);

        /* add the copied bytes into the buffer length */
        buf_len += copy_len;

        /* advance past the copied bytes in the source */
        idx += copy_len;
        len -= copy_len;

        /* translate the bytes through the character set mapping */
        str_cur = mapper->map2(&dst, &str_len, (char *)buf, buf_len,
                               &partial_len);

        /* 
         *   if this would push us over the maximum string size, we can't
         *   convert the data 
         */
        if (str_cur > OSMALMAX - str_total - VMB_LEN)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* add the current length into the total string length */
        str_total += str_cur;

        /* copy the partial last character bytes to the start of the buffer */
        if (partial_len != 0)
            memmove(buf, buf + buf_len - partial_len, partial_len);

        /* the buffer now contains only the partial character bytes */
        buf_len = partial_len;
    }

    /* return the total string length */
    return str_total;
}